

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

wchar_t history_def_init(void **p,HistEventW *ev,wchar_t n)

{
  undefined4 *puVar1;
  history_t *h;
  wchar_t n_local;
  HistEventW *ev_local;
  void **p_local;
  
  puVar1 = (undefined4 *)malloc(0x40);
  if (puVar1 == (undefined4 *)0x0) {
    p_local._4_4_ = L'\xffffffff';
  }
  else {
    h._4_4_ = n;
    if (n < L'\x01') {
      h._4_4_ = L'\0';
    }
    puVar1[0xe] = 0;
    puVar1[0xd] = 0;
    puVar1[0xc] = h._4_4_;
    *(undefined4 **)(puVar1 + 8) = puVar1;
    *(undefined4 **)(puVar1 + 6) = puVar1;
    *(undefined8 *)(puVar1 + 2) = 0;
    *puVar1 = 0;
    *(undefined4 **)(puVar1 + 10) = puVar1;
    puVar1[0xf] = 0;
    *p = puVar1;
    p_local._4_4_ = L'\0';
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_init(void **p, TYPE(HistEvent) *ev __attribute__((__unused__)), int n)
{
	history_t *h = (history_t *) h_malloc(sizeof(*h));
	if (h == NULL)
		return -1;

	if (n <= 0)
		n = 0;
	h->eventid = 0;
	h->cur = 0;
	h->max = n;
	h->list.next = h->list.prev = &h->list;
	h->list.ev.str = NULL;
	h->list.ev.num = 0;
	h->cursor = &h->list;
	h->flags = 0;
	*p = h;
	return 0;
}